

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall re2::CharClassBuilder::RemoveAbove(CharClassBuilder *this,Rune r)

{
  RuneRange RVar1;
  int iVar2;
  bool bVar3;
  reference pRVar4;
  iterator this_00;
  int in_ESI;
  const_iterator in_RDI;
  pair<std::_Rb_tree_const_iterator<re2::RuneRange>,_bool> pVar5;
  RuneRange rr;
  iterator it;
  CharClassBuilder *in_stack_ffffffffffffff98;
  key_type *__x;
  undefined1 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffb9;
  int local_30;
  int iStack_2c;
  _Self local_28;
  RuneRange local_20;
  _Self local_18;
  int local_c;
  
  if (in_ESI < 0x10ffff) {
    if (in_ESI < 0x7a) {
      if (in_ESI < 0x61) {
        *(undefined4 *)&(in_RDI._M_node)->field_0x4 = 0;
      }
      else {
        *(uint *)&(in_RDI._M_node)->field_0x4 =
             0x3ffffffU >> (0x7aU - (char)in_ESI & 0x1f) & *(uint *)&(in_RDI._M_node)->field_0x4;
      }
    }
    local_c = in_ESI;
    if (in_ESI < 0x5a) {
      if (in_ESI < 0x41) {
        *(undefined4 *)&((_Rep_type *)&(in_RDI._M_node)->_M_color)->_M_impl = 0;
      }
      else {
        *(uint *)&((_Rep_type *)&(in_RDI._M_node)->_M_color)->_M_impl =
             0x3ffffffU >> (0x5aU - (char)in_ESI & 0x1f) &
             *(uint *)&((_Rep_type *)&(in_RDI._M_node)->_M_color)->_M_impl;
      }
    }
    while( true ) {
      __x = (key_type *)&(in_RDI._M_node)->_M_left;
      RuneRange::RuneRange(&local_20,local_c + 1,0x10ffff);
      local_18._M_node =
           (_Base_ptr)
           std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::find
                     (in_RDI._M_node,__x);
      local_28._M_node = (_Base_ptr)end(in_stack_ffffffffffffff98);
      bVar3 = std::operator==(&local_18,&local_28);
      if (bVar3) break;
      pRVar4 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator*
                         ((_Rb_tree_const_iterator<re2::RuneRange> *)0x20d576);
      RVar1 = *pRVar4;
      this_00 = std::set<re2::RuneRange,re2::RuneRangeLess,std::allocator<re2::RuneRange>>::
                erase_abi_cxx11_((set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
                                  *)__x,in_RDI);
      iVar2 = local_c;
      iStack_2c = RVar1.hi;
      local_30 = RVar1.lo;
      (((_Rb_tree_header *)&(in_RDI._M_node)->_M_parent)->_M_header)._M_color =
           (((_Rb_tree_header *)&(in_RDI._M_node)->_M_parent)->_M_header)._M_color -
           ((iStack_2c - local_30) + 1);
      if (local_30 <= local_c) {
        pVar5 = std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::
                insert((set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_> *)
                       this_00._M_node,
                       (value_type *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8));
        in_stack_ffffffffffffffb8 = pVar5.second;
        (((_Rb_tree_header *)&(in_RDI._M_node)->_M_parent)->_M_header)._M_color =
             (iVar2 - local_30) + 1 +
             (((_Rb_tree_header *)&(in_RDI._M_node)->_M_parent)->_M_header)._M_color;
      }
    }
  }
  return;
}

Assistant:

void CharClassBuilder::RemoveAbove(Rune r) {
  if (r >= Runemax)
    return;

  if (r < 'z') {
    if (r < 'a')
      lower_ = 0;
    else
      lower_ &= AlphaMask >> ('z' - r);
  }

  if (r < 'Z') {
    if (r < 'A')
      upper_ = 0;
    else
      upper_ &= AlphaMask >> ('Z' - r);
  }

  for (;;) {

    iterator it = ranges_.find(RuneRange(r + 1, Runemax));
    if (it == end())
      break;
    RuneRange rr = *it;
    ranges_.erase(it);
    nrunes_ -= rr.hi - rr.lo + 1;
    if (rr.lo <= r) {
      rr.hi = r;
      ranges_.insert(rr);
      nrunes_ += rr.hi - rr.lo + 1;
    }
  }
}